

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_utils.h
# Opt level: O2

uint64_t SipHash(uint64_t k0,uint64_t k1,uint64_t data)

{
  long in_FS_OFFSET;
  uint64_t v3;
  uint64_t v2;
  uint64_t v1;
  uint64_t v0;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = k0 ^ 0x736f6d6570736575;
  local_40 = k1 ^ 0x646f72616e646f6d;
  local_48 = k0 ^ 0x6c7967656e657261;
  local_50 = k1 ^ data ^ 0x7465646279746573;
  SipHashRound(&local_38,&local_40,&local_48,&local_50);
  SipHashRound(&local_38,&local_40,&local_48,&local_50);
  local_38 = local_38 ^ data;
  local_50 = local_50 ^ 0x800000000000000;
  SipHashRound(&local_38,&local_40,&local_48,&local_50);
  SipHashRound(&local_38,&local_40,&local_48,&local_50);
  local_38 = local_38 ^ 0x800000000000000;
  local_48 = CONCAT71(local_48._1_7_,~(byte)local_48);
  SipHashRound(&local_38,&local_40,&local_48,&local_50);
  SipHashRound(&local_38,&local_40,&local_48,&local_50);
  SipHashRound(&local_38,&local_40,&local_48,&local_50);
  SipHashRound(&local_38,&local_40,&local_48,&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return local_40 ^ local_38 ^ local_48 ^ local_50;
  }
  __stack_chk_fail();
}

Assistant:

inline uint64_t SipHash(uint64_t k0, uint64_t k1, uint64_t data) {
    uint64_t v0 = 0x736f6d6570736575ULL ^ k0;
    uint64_t v1 = 0x646f72616e646f6dULL ^ k1;
    uint64_t v2 = 0x6c7967656e657261ULL ^ k0;
    uint64_t v3 = 0x7465646279746573ULL ^ k1 ^ data;
    SipHashRound(v0, v1, v2, v3);
    SipHashRound(v0, v1, v2, v3);
    v0 ^= data;
    v3 ^= 0x800000000000000ULL;
    SipHashRound(v0, v1, v2, v3);
    SipHashRound(v0, v1, v2, v3);
    v0 ^= 0x800000000000000ULL;
    v2 ^= 0xFF;
    SipHashRound(v0, v1, v2, v3);
    SipHashRound(v0, v1, v2, v3);
    SipHashRound(v0, v1, v2, v3);
    SipHashRound(v0, v1, v2, v3);
    return v0 ^ v1 ^ v2 ^ v3;
}